

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bcatcstr(bstring b,char *s)

{
  uchar uVar1;
  uchar *puVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  
  if ((b != (bstring)0x0) && (puVar2 = b->data, puVar2 != (uchar *)0x0)) {
    uVar7 = b->slen;
    if ((-1 < (int)uVar7) &&
       ((iVar3 = b->mlen, (int)uVar7 <= iVar3 && (s != (char *)0x0 && iVar3 != 0)))) {
      iVar6 = iVar3 - uVar7;
      if (iVar6 == 0 || iVar3 < (int)uVar7) {
        iVar6 = 0;
      }
      else {
        lVar4 = 0;
        do {
          uVar1 = s[lVar4];
          puVar2[lVar4 + (ulong)uVar7] = uVar1;
          if (uVar1 == '\0') {
            b->slen = b->slen + (int)lVar4;
            return 0;
          }
          lVar4 = lVar4 + 1;
        } while (iVar6 != (int)lVar4);
        uVar7 = b->slen;
        s = s + lVar4;
      }
      b->slen = uVar7 + iVar6;
      sVar5 = strlen(s);
      iVar3 = bcatblk(b,s,(int)sVar5);
      return iVar3;
    }
  }
  return -1;
}

Assistant:

int bcatcstr (bstring b, const char * s) {
char * d;
int i, l;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL) return BSTR_ERR;

	/* Optimistically concatenate directly */
	l = b->mlen - b->slen;
	d = (char *) &b->data[b->slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			b->slen += i;
			return BSTR_OK;
		}
	}
	b->slen += i;

	/* Need to explicitely resize and concatenate tail */
	return bcatblk (b, (const void *) s, (int) strlen (s));
}